

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O2

KcpTcpEventLoop * __thiscall
sznet::net::KcpTcpEventLoopThreadPool::getNextLoop(KcpTcpEventLoopThreadPool *this)

{
  pointer ppKVar1;
  pointer ppKVar2;
  KcpTcpEventLoop *pKVar3;
  int iVar4;
  ulong uVar5;
  
  EventLoop::assertInLoopThread(&this->m_baseLoop->super_EventLoop);
  if (this->m_started != false) {
    ppKVar1 = (this->m_loops).
              super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppKVar2 = (this->m_loops).
              super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppKVar1 == ppKVar2) {
      pKVar3 = this->m_baseLoop;
    }
    else {
      pKVar3 = ppKVar1[this->m_next];
      uVar5 = (long)this->m_next + 1;
      iVar4 = 0;
      if (uVar5 < (ulong)((long)ppKVar2 - (long)ppKVar1 >> 3)) {
        iVar4 = (int)uVar5;
      }
      this->m_next = iVar4;
    }
    return pKVar3;
  }
  __assert_fail("m_started",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                ,0x3c,"KcpTcpEventLoop *sznet::net::KcpTcpEventLoopThreadPool::getNextLoop()");
}

Assistant:

KcpTcpEventLoop* KcpTcpEventLoopThreadPool::getNextLoop()
{
	m_baseLoop->assertInLoopThread();
	assert(m_started);
	KcpTcpEventLoop* loop = m_baseLoop;

	if (!m_loops.empty())
	{
		// round-robin
		loop = m_loops[m_next];
		++m_next;
		if (implicit_cast<size_t>(m_next) >= m_loops.size())
		{
			m_next = 0;
		}
	}
	return loop;
}